

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.cc
# Opt level: O0

void blake2b_mix(uint64_t *v,int a,int b,int c,int d,uint64_t x,uint64_t y)

{
  uint64_t uVar1;
  uint64_t x_local;
  int d_local;
  int c_local;
  int b_local;
  int a_local;
  uint64_t *v_local;
  
  v[a] = v[a] + v[b] + x;
  uVar1 = CRYPTO_rotr_u64(v[d] ^ v[a],0x20);
  v[d] = uVar1;
  v[c] = v[c] + v[d];
  uVar1 = CRYPTO_rotr_u64(v[b] ^ v[c],0x18);
  v[b] = uVar1;
  v[a] = v[a] + v[b] + y;
  uVar1 = CRYPTO_rotr_u64(v[d] ^ v[a],0x10);
  v[d] = uVar1;
  v[c] = v[c] + v[d];
  uVar1 = CRYPTO_rotr_u64(v[b] ^ v[c],0x3f);
  v[b] = uVar1;
  return;
}

Assistant:

static void blake2b_mix(uint64_t v[16], int a, int b, int c, int d, uint64_t x,
                        uint64_t y) {
  v[a] = v[a] + v[b] + x;
  v[d] = CRYPTO_rotr_u64(v[d] ^ v[a], 32);
  v[c] = v[c] + v[d];
  v[b] = CRYPTO_rotr_u64(v[b] ^ v[c], 24);
  v[a] = v[a] + v[b] + y;
  v[d] = CRYPTO_rotr_u64(v[d] ^ v[a], 16);
  v[c] = v[c] + v[d];
  v[b] = CRYPTO_rotr_u64(v[b] ^ v[c], 63);
}